

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O0

string * helper::int_to_hex<unsigned_char>(string *__return_storage_ptr__,u8 i)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  stringstream local_1a0 [8];
  stringstream stream;
  undefined1 local_190 [383];
  byte local_11;
  string *psStack_10;
  u8 i_local;
  
  local_11 = i;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(local_190,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
  std::ostream::operator<<(poVar3,(uint)local_11);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string int_to_hex( u8 i )
	{
		std::stringstream stream;
		stream << std::setfill( '0' ) << std::setw( 2 )
			<< std::hex << static_cast<int>( i );
		return stream.str();
	}